

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.cpp
# Opt level: O0

void test_qclab_dense_transpose_complex<std::complex<float>>(void)

{
  bool bVar1;
  char *pcVar2;
  complex<float> in_RCX;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  complex<float> m01_02;
  complex<float> m01_03;
  complex<float> m01_04;
  complex<float> m01_05;
  complex<float> m01_06;
  complex<float> in_RSI;
  complex<float> in_R8;
  complex<float> in_R9;
  complex<float> in_stack_fffffffffffff9e8;
  complex<float> in_stack_fffffffffffff9f0;
  complex<float> in_stack_fffffffffffff9f8;
  AssertHelper local_588;
  Message local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_12;
  M m5_1;
  Message local_550;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_11;
  M m4_1;
  Message local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_10;
  M m3_2;
  Message local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_9;
  M m2_2;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_8;
  M m1_2;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_7;
  M m5;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_6;
  M m4;
  Message local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_5;
  M m3_1;
  Message local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_4;
  M m2_1;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_3;
  M m1_1;
  Message local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_2;
  M m3;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_1;
  M m2;
  Message local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar;
  M m1;
  complex<float> local_310;
  complex<float> local_308;
  complex<float> local_300;
  complex<float> local_2f8;
  complex<float> local_2f0;
  complex<float> local_2e8;
  complex<float> local_2e0;
  complex<float> local_2d8;
  complex<float> local_2d0;
  complex<float> local_2c8;
  complex<float> local_2c0;
  complex<float> local_2b8;
  complex<float> local_2b0;
  complex<float> local_2a8;
  complex<float> local_2a0;
  undefined1 local_298 [8];
  M check2H;
  complex<float> local_280;
  complex<float> local_278;
  complex<float> local_270;
  undefined1 local_268 [8];
  M check1H;
  complex<float> local_250;
  complex<float> local_248;
  complex<float> local_240;
  complex<float> local_238;
  complex<float> local_230;
  complex<float> local_228;
  complex<float> local_220;
  complex<float> local_218;
  complex<float> local_210;
  complex<float> local_208;
  complex<float> local_200;
  complex<float> local_1f8;
  complex<float> local_1f0;
  complex<float> local_1e8;
  complex<float> local_1e0;
  undefined1 local_1d8 [8];
  M check2T;
  complex<float> local_1c0;
  complex<float> local_1b8;
  complex<float> local_1b0;
  undefined1 local_1a8 [8];
  M check1T;
  complex<float> local_190;
  complex<float> local_188;
  complex<float> local_180;
  complex<float> local_178;
  complex<float> local_170;
  complex<float> local_168;
  complex<float> local_160;
  complex<float> local_158;
  complex<float> local_150;
  complex<float> local_148;
  complex<float> local_140;
  complex<float> local_138;
  complex<float> local_130;
  complex<float> local_128;
  complex<float> local_120;
  undefined1 local_118 [8];
  M check2;
  complex<float> local_100;
  complex<float> local_f8;
  complex<float> local_f0;
  undefined1 local_e8 [8];
  M check1;
  complex<float> local_d0;
  complex<float> local_c8;
  complex<float> local_c0;
  complex<float> local_b8;
  complex<float> local_b0;
  complex<float> local_a8;
  complex<float> local_a0;
  complex<float> local_94;
  complex<float> local_8c;
  complex<float> local_84;
  complex<float> local_7c;
  complex<float> local_74;
  complex<float> local_6c;
  complex<float> local_64 [2];
  complex<float> local_50;
  undefined1 local_48 [8];
  M matrix2;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20;
  undefined1 local_18 [8];
  M matrix1;
  
  std::complex<float>::complex(&local_20,1.0,5.0);
  std::complex<float>::complex(&local_28,2.0,6.0);
  std::complex<float>::complex(&local_30,3.0,7.0);
  std::complex<float>::complex((complex<float> *)&matrix2.data_,4.0,8.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18,in_RSI,m01,in_RCX,in_R8);
  std::complex<float>::complex(&local_50,0.0,1.0);
  std::complex<float>::complex(local_64,0.0,5.0);
  std::complex<float>::complex(&local_6c,0.0,9.0);
  std::complex<float>::complex(&local_74,0.0,13.0);
  std::complex<float>::complex(&local_7c,0.0,2.0);
  std::complex<float>::complex(&local_84,0.0,6.0);
  std::complex<float>::complex(&local_8c,0.0,10.0);
  std::complex<float>::complex(&local_94,0.0,14.0);
  std::complex<float>::complex(&local_a0,0.0,3.0);
  std::complex<float>::complex(&local_a8,0.0,7.0);
  std::complex<float>::complex(&local_b0,0.0,11.0);
  std::complex<float>::complex(&local_b8,0.0,15.0);
  std::complex<float>::complex(&local_c0,0.0,4.0);
  std::complex<float>::complex(&local_c8,0.0,8.0);
  std::complex<float>::complex(&local_d0,0.0,12.0);
  std::complex<float>::complex((complex<float> *)&check1.data_,0.0,16.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_48,in_RSI,m01_00,local_a0,in_R8,in_R9,
             local_a0,local_a8,local_b0,local_b8,local_c0,local_c8,local_d0,
             (complex<float>)
             check1.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8);
  std::complex<float>::complex(&local_f0,1.0,5.0);
  std::complex<float>::complex(&local_f8,2.0,6.0);
  std::complex<float>::complex(&local_100,3.0,7.0);
  std::complex<float>::complex((complex<float> *)&check2.data_,4.0,8.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_e8,in_RSI,m01_01,local_a0,in_R8);
  std::complex<float>::complex(&local_120,0.0,1.0);
  std::complex<float>::complex(&local_128,0.0,5.0);
  std::complex<float>::complex(&local_130,0.0,9.0);
  std::complex<float>::complex(&local_138,0.0,13.0);
  std::complex<float>::complex(&local_140,0.0,2.0);
  std::complex<float>::complex(&local_148,0.0,6.0);
  std::complex<float>::complex(&local_150,0.0,10.0);
  std::complex<float>::complex(&local_158,0.0,14.0);
  std::complex<float>::complex(&local_160,0.0,3.0);
  std::complex<float>::complex(&local_168,0.0,7.0);
  std::complex<float>::complex(&local_170,0.0,11.0);
  std::complex<float>::complex(&local_178,0.0,15.0);
  std::complex<float>::complex(&local_180,0.0,4.0);
  std::complex<float>::complex(&local_188,0.0,8.0);
  std::complex<float>::complex(&local_190,0.0,12.0);
  std::complex<float>::complex((complex<float> *)&check1T.data_,0.0,16.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_118,in_RSI,m01_02,local_160,in_R8,in_R9,
             local_160,local_168,local_170,local_178,local_180,local_188,local_190,
             (complex<float>)
             check1T.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8);
  std::complex<float>::complex(&local_1b0,1.0,5.0);
  std::complex<float>::complex(&local_1b8,3.0,7.0);
  std::complex<float>::complex(&local_1c0,2.0,6.0);
  std::complex<float>::complex((complex<float> *)&check2T.data_,4.0,8.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1a8,in_RSI,m01_03,local_160,in_R8);
  std::complex<float>::complex(&local_1e0,0.0,1.0);
  std::complex<float>::complex(&local_1e8,0.0,2.0);
  std::complex<float>::complex(&local_1f0,0.0,3.0);
  std::complex<float>::complex(&local_1f8,0.0,4.0);
  std::complex<float>::complex(&local_200,0.0,5.0);
  std::complex<float>::complex(&local_208,0.0,6.0);
  std::complex<float>::complex(&local_210,0.0,7.0);
  std::complex<float>::complex(&local_218,0.0,8.0);
  std::complex<float>::complex(&local_220,0.0,9.0);
  std::complex<float>::complex(&local_228,0.0,10.0);
  std::complex<float>::complex(&local_230,0.0,11.0);
  std::complex<float>::complex(&local_238,0.0,12.0);
  std::complex<float>::complex(&local_240,0.0,13.0);
  std::complex<float>::complex(&local_248,0.0,14.0);
  std::complex<float>::complex(&local_250,0.0,15.0);
  std::complex<float>::complex((complex<float> *)&check1H.data_,0.0,16.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1d8,in_RSI,m01_04,local_220,in_R8,in_R9,
             local_220,local_228,local_230,local_238,local_240,local_248,local_250,
             (complex<float>)
             check1H.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8);
  std::complex<float>::complex(&local_270,1.0,-5.0);
  std::complex<float>::complex(&local_278,3.0,-7.0);
  std::complex<float>::complex(&local_280,2.0,-6.0);
  std::complex<float>::complex((complex<float> *)&check2H.data_,4.0,-8.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_268,in_RSI,m01_05,local_220,in_R8);
  std::complex<float>::complex(&local_2a0,0.0,-1.0);
  std::complex<float>::complex(&local_2a8,0.0,-2.0);
  std::complex<float>::complex(&local_2b0,0.0,-3.0);
  std::complex<float>::complex(&local_2b8,0.0,-4.0);
  std::complex<float>::complex(&local_2c0,0.0,-5.0);
  std::complex<float>::complex(&local_2c8,0.0,-6.0);
  std::complex<float>::complex(&local_2d0,0.0,-7.0);
  std::complex<float>::complex(&local_2d8,0.0,-8.0);
  std::complex<float>::complex(&local_2e0,0.0,-9.0);
  std::complex<float>::complex(&local_2e8,0.0,-10.0);
  std::complex<float>::complex(&local_2f0,0.0,-11.0);
  std::complex<float>::complex(&local_2f8,0.0,-12.0);
  std::complex<float>::complex(&local_300,0.0,-13.0);
  std::complex<float>::complex(&local_308,0.0,-14.0);
  std::complex<float>::complex(&local_310,0.0,-15.0);
  std::complex<float>::complex((complex<float> *)&m1.data_,0.0,-16.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_298,in_RSI,m01_06,local_2e0,in_R8,in_R9,
             local_2e0,local_2e8,local_2f0,local_2f8,local_300,local_308,local_310,
             (complex<float>)
             m1.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl,
             in_stack_fffffffffffff9e8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,
             (SquareMatrix<std::complex<float>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (NoTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_338,"m1","check1",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar.message_,
             (SquareMatrix<std::complex<float>_> *)local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.data_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.data_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (NoTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_368,"m2","check2",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_,
             (SquareMatrix<std::complex<float>_> *)local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3.data_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3.data_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_2.message_,NoTrans,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_398,"m3","check2",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_2.message_,
             (SquareMatrix<std::complex<float>_> *)local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_1.data_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_1.data_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_1.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_,
             (SquareMatrix<std::complex<float>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (Trans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_3c8,"m1","check1T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_,
             (SquareMatrix<std::complex<float>_> *)local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_1.data_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_1.data_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (Trans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_3f8,"m2","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_1.data_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_1.data_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_5.message_,Trans,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_428,"m3","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4.data_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4.data_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::transInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_458,"m4","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5.data_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5.data_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_7.message_,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_488,"m5","check2T",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_7.message_,
             (SquareMatrix<std::complex<float>_> *)local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_2.data_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_2.data_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_6.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_4.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_3.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_,
             (SquareMatrix<std::complex<float>_> *)local_18);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (ConjTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_4b8,"m1","check1H",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_,
             (SquareMatrix<std::complex<float>_> *)local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_2.data_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_2.data_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            (ConjTrans,(SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_4e8,"m2","check2H",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_,
             (SquareMatrix<std::complex<float>_> *)local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_2.data_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_2.data_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  qclab::dense::operate<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_10.message_,ConjTrans,(SquareMatrix<std::complex<float>_> *)local_48
            );
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_518,"m3","check2H",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_10.message_,
             (SquareMatrix<std::complex<float>_> *)local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4_1.data_,&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4_1.data_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_,
             (SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::conjTransInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_548,"m4","check2H",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_,
             (SquareMatrix<std::complex<float>_> *)local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5_1.data_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5_1.data_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&gtest_ar_12.message_,(SquareMatrix<std::complex<float>_> *)local_48);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<std::complex<float>_>,_qclab::dense::SquareMatrix<std::complex<float>_>,_nullptr>
            ((EqHelper *)local_578,"m5","check2H",
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_12.message_,
             (SquareMatrix<std::complex<float>_> *)local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_12.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_11.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_10.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_9.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_8.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_298);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_268);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1a8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_118);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_e8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18);
  return;
}

Assistant:

void test_qclab_dense_transpose_complex() {

  using M = qclab::dense::SquareMatrix< T > ;

  M matrix1( T(1,5) , T(2,6) ,
             T(3,7) , T(4,8) ) ;
  M matrix2( T(0,1) , T(0,5) , T(0, 9) , T(0,13) ,
             T(0,2) , T(0,6) , T(0,10) , T(0,14) ,
             T(0,3) , T(0,7) , T(0,11) , T(0,15) ,
             T(0,4) , T(0,8) , T(0,12) , T(0,16) ) ;

  M check1( T(1,5) , T(2,6) ,
            T(3,7) , T(4,8) ) ;
  M check2( T(0,1) , T(0,5) , T(0, 9) , T(0,13) ,
            T(0,2) , T(0,6) , T(0,10) , T(0,14) ,
            T(0,3) , T(0,7) , T(0,11) , T(0,15) ,
            T(0,4) , T(0,8) , T(0,12) , T(0,16) ) ;

  M check1T( T(1,5) , T(3,7) ,
             T(2,6) , T(4,8) ) ;
  M check2T( T(0, 1) , T(0, 2) , T(0, 3) , T(0, 4) ,
             T(0, 5) , T(0, 6) , T(0, 7) , T(0, 8) ,
             T(0, 9) , T(0,10) , T(0,11) , T(0,12) ,
             T(0,13) , T(0,14) , T(0,15) , T(0,16) ) ;

  M check1H( T(1,-5) , T(3,-7) ,
             T(2,-6) , T(4,-8) ) ;
  M check2H( T(0, -1) , T(0, -2) , T(0, -3) , T(0, -4) ,
             T(0, -5) , T(0, -6) , T(0, -7) , T(0, -8) ,
             T(0, -9) , T(0,-10) , T(0,-11) , T(0,-12) ,
             T(0,-13) , T(0,-14) , T(0,-15) , T(0,-16) ) ;

  // NoTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m1 ) ;
    EXPECT_EQ( m1 , check1 ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m2 ) ;
    EXPECT_EQ( m2 , check2 ) ;
    M m3 = qclab::dense::operate( qclab::Op::NoTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2 ) ;
  }

  // Trans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::Trans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::transInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::trans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

  // ConjTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m1 ) ;
    EXPECT_EQ( m1 , check1H ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m2 ) ;
    EXPECT_EQ( m2 , check2H ) ;
    M m3 = qclab::dense::operate( qclab::Op::ConjTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2H ) ;
    M m4( matrix2 ) ;
    qclab::dense::conjTransInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2H ) ;
    M m5 = qclab::dense::conjTrans( matrix2 ) ;
    EXPECT_EQ( m5 , check2H ) ;
  }

}